

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_resetNotEqualByTestValueId_Test::TestBody(Equality_resetNotEqualByTestValueId_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  AssertHelper local_70 [8];
  Message local_68 [8];
  AssertionResult local_60 [2];
  ResetPtr r1;
  AssertionResult gtest_ar_;
  ResetPtr r2;
  
  createInitialisedReset();
  createInitialisedReset();
  peVar1 = r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"tv_alt_id",(allocator<char> *)&gtest_ar_);
  libcellml::Reset::setTestValueId((string *)peVar1);
  std::__cxx11::string::~string((string *)local_60);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Reset,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_60,
             &r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60[0].message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_60,&gtest_ar_.success_,"r1->equals(r2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x210,(char *)local_60[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Reset,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_60,
             &r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60[0].message_);
  if (bVar2 != 0) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_60,&gtest_ar_.success_,"r2->equals(r1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x211,(char *)local_60[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, resetNotEqualByTestValueId)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    r1->setTestValueId("tv_alt_id");

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}